

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_helper-inl.h
# Opt level: O0

ssize_t __thiscall
spdlog::details::file_helper::write(file_helper *this,int __fd,void *__buf,size_t __n)

{
  bool bVar1;
  undefined7 extraout_var;
  undefined4 in_register_00000034;
  char *data;
  size_t msg_size;
  filename_t *in_stack_ffffffffffffff78;
  void *in_stack_ffffffffffffff80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  file_helper *__lhs;
  int last_errno;
  string *in_stack_ffffffffffffff90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60 [2];
  char *local_20;
  size_t local_18;
  buffer<char> *local_10;
  file_helper *local_8;
  
  local_10 = (buffer<char> *)CONCAT44(in_register_00000034,__fd);
  if (this->fd_ != (FILE *)0x0) {
    local_8 = this;
    local_18 = ::fmt::v11::detail::buffer<char>::size(local_10);
    local_20 = ::fmt::v11::detail::buffer<char>::data(local_10);
    __lhs = this;
    bVar1 = details::os::fwrite_bytes
                      (in_stack_ffffffffffffff80,(size_t)in_stack_ffffffffffffff78,(FILE *)0x63acd6)
    ;
    this = (file_helper *)CONCAT71(extraout_var,bVar1);
    if (!bVar1) {
      __rhs = local_60;
      details::os::filename_to_str(in_stack_ffffffffffffff78);
      std::operator+((char *)__lhs,__rhs);
      last_errno = (int)((ulong)__lhs >> 0x20);
      __errno_location();
      throw_spdlog_ex(in_stack_ffffffffffffff90,last_errno);
    }
  }
  return (ssize_t)this;
}

Assistant:

SPDLOG_INLINE void file_helper::write(const memory_buf_t &buf) {
    if (fd_ == nullptr) return;
    size_t msg_size = buf.size();
    auto data = buf.data();

    if (!details::os::fwrite_bytes(data, msg_size, fd_)) {
        throw_spdlog_ex("Failed writing to file " + os::filename_to_str(filename_), errno);
    }
}